

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::format
          (LocalizedNumberFormatterAsFormat *this,Formattable *obj,UnicodeString *appendTo,
          FieldPositionIterator *posIter,UErrorCode *status)

{
  FieldPositionIteratorHandler fpih;
  UFormattedNumberData data;
  UnicodeString local_1c0;
  UFormattedNumberData local_180;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UFormattedNumberData::UFormattedNumberData(&local_180);
    Formattable::populateDecimalQuantity(obj,&local_180.quantity,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      LocalizedNumberFormatter::formatImpl(&this->fFormatter,&local_180,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        NumberStringBuilder::toTempUnicodeString(&local_1c0,&local_180.string);
        UnicodeString::append(appendTo,&local_1c0);
        UnicodeString::~UnicodeString(&local_1c0);
        if (posIter != (FieldPositionIterator *)0x0) {
          FieldPositionIteratorHandler::FieldPositionIteratorHandler
                    ((FieldPositionIteratorHandler *)&local_1c0,posIter,status);
          NumberStringBuilder::getAllFieldPositions
                    (&local_180.string,(FieldPositionIteratorHandler *)&local_1c0,status);
          FieldPositionIteratorHandler::~FieldPositionIteratorHandler
                    ((FieldPositionIteratorHandler *)&local_1c0);
        }
      }
    }
    UFormattedNumberData::~UFormattedNumberData(&local_180);
  }
  return appendTo;
}

Assistant:

UnicodeString& LocalizedNumberFormatterAsFormat::format(const Formattable& obj, UnicodeString& appendTo,
                                                        FieldPositionIterator* posIter,
                                                        UErrorCode& status) const {
    if (U_FAILURE(status)) { return appendTo; }
    UFormattedNumberData data;
    obj.populateDecimalQuantity(data.quantity, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    fFormatter.formatImpl(&data, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    appendTo.append(data.string.toTempUnicodeString());
    if (posIter != nullptr) {
        FieldPositionIteratorHandler fpih(posIter, status);
        data.string.getAllFieldPositions(fpih, status);
    }
    return appendTo;
}